

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O3

char * cmime_string_encode_to_7bit(char *s,CMimeStringEncodingType_T t)

{
  int iVar1;
  CMimeInfo_T *mi;
  char *s_00;
  char *pcVar2;
  char *local_28;
  char *out;
  
  local_28 = (char *)0x0;
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,0x83,"char *cmime_string_encode_to_7bit(const char *, CMimeStringEncodingType_T)"
                 );
  }
  mi = cmime_util_info_get_from_string(s);
  iVar1 = strcmp(mi->mime_encoding,"us-ascii");
  if (iVar1 == 0) {
    local_28 = strdup(s);
    goto LAB_001097cb;
  }
  if (t == CMIME_STRING_ENCODING_QP) {
    s_00 = cmime_qp_encode(s,(char *)0x0);
    cmime_string_chomp(s_00);
    pcVar2 = "q";
LAB_0010978a:
    pcVar2 = strdup(pcVar2);
  }
  else {
    if (t == CMIME_STRING_ENCODING_B64) {
      s_00 = cmime_base64_encode_string(s);
      pcVar2 = "b";
      goto LAB_0010978a;
    }
    s_00 = strdup(s);
    pcVar2 = (char *)0x0;
  }
  asprintf(&local_28,"=?%s?%s?%s?=",mi->mime_encoding,pcVar2,s_00);
  free(s_00);
  free(pcVar2);
LAB_001097cb:
  cmime_util_info_free(mi);
  return local_28;
}

Assistant:

char *cmime_string_encode_to_7bit(const char *s, CMimeStringEncodingType_T t) {
    CMimeInfo_T *mi = NULL;
    char *out = NULL;
    char *ptemp = NULL;
    char *enc = NULL;

    assert(s);

    // =?charset?encoding?text?=
    mi = cmime_util_info_get_from_string(s);

    if (strcmp(mi->mime_encoding,"us-ascii")!=0) {
        if (t == CMIME_STRING_ENCODING_B64) {
            ptemp = cmime_base64_encode_string(s); 
            enc = strdup("b");
        } else if (t == CMIME_STRING_ENCODING_QP) {
            ptemp = cmime_qp_encode((char *)s,NULL); 
            ptemp = cmime_string_chomp(ptemp);
            enc = strdup("q");
        } else {
            ptemp = strdup(s);
        }

        asprintf(&out,"=?%s?%s?%s?=",mi->mime_encoding,enc,ptemp);
        free(ptemp);
        free(enc);
    } else {
        out = strdup(s);
    }

    cmime_util_info_free(mi);
    return out;
}